

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O2

const_iterator __thiscall
frozen::
set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
::find<std::basic_string_view<char,std::char_traits<char>>>
          (set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  bool bVar1;
  const_iterator __y;
  
  __y = lower_bound<std::basic_string_view<char,std::char_traits<char>>>(this,key);
  if ((__y != (const_iterator)(this + 0x58)) &&
     (bVar1 = CLI::std::less<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                        ((less<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,key,
                         __y), !bVar1)) {
    return __y;
  }
  return (const_iterator)(this + 0x58);
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !less_than_(key, *where))
      return where;
    else
      return end();
  }